

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void check_call_unroll(jit_State *J,TraceNo lnk)

{
  int iVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  TValue *pTVar7;
  
  iVar1 = J->framedepth;
  iVar5 = (int)((char)(J->pt->flags << 6) >> 7);
  iVar6 = iVar5 + iVar1;
  if (iVar6 == 0 || SCARRY4(iVar5,iVar1) != iVar6 < 0) {
    iVar5 = 0;
  }
  else {
    pTVar2 = J->L->base;
    pTVar7 = pTVar2 + -1;
    iVar5 = 0;
    do {
      uVar3 = pTVar7->u64;
      if ((uVar3 & 3) == 0) {
        pTVar7 = pTVar7 + (-2 - (ulong)*(byte *)(uVar3 - 3));
      }
      else {
        pTVar7 = (TValue *)((long)pTVar7 - (uVar3 & 0xfffffffffffffff8));
      }
      iVar5 = iVar5 + (uint)(*(long *)((pTVar7[-1].u64 & 0x7fffffffffff) + 0x20) ==
                            *(long *)((pTVar2[-2].u64 & 0x7fffffffffff) + 0x20));
      iVar6 = (iVar6 - (uint)(((uint)uVar3 & 7) == 2)) + -1;
    } while (0 < iVar6);
  }
  if (J->pc == J->startpc) {
    if (J->param[0xc] < iVar5 + J->tailcalled) {
      J->pc = J->pc + 1;
      lj_record_stop(J,(iVar1 + J->retdepth != 0) + LJ_TRLINK_TAILREC,(uint)(J->cur).traceno);
      return;
    }
  }
  else if (J->param[0xb] < iVar5) {
    if (lnk != 0) {
      lj_trace_flush(J,lnk);
      uVar4 = lj_prng_u64((PRNGState *)&J[-1].penalty[0x3b].val);
      *(ushort *)((long)&J[1].cur.nextgc.gcptr64 + (ulong)(*(int *)&J->pc + 4U >> 1 & 0x7e)) =
           (ushort)uVar4 & 0xf;
    }
    lj_trace_err(J,LJ_TRERR_CUNROLL);
  }
  return;
}

Assistant:

static void check_call_unroll(jit_State *J, TraceNo lnk)
{
  cTValue *frame = J->L->base - 1;
  void *pc = mref(frame_func(frame)->l.pc, void);
  int32_t depth = J->framedepth;
  int32_t count = 0;
  if ((J->pt->flags & PROTO_VARARG)) depth--;  /* Vararg frame still missing. */
  for (; depth > 0; depth--) {  /* Count frames with same prototype. */
    if (frame_iscont(frame)) depth--;
    frame = frame_prev(frame);
    if (mref(frame_func(frame)->l.pc, void) == pc)
      count++;
  }
  if (J->pc == J->startpc) {
    if (count + J->tailcalled > J->param[JIT_P_recunroll]) {
      J->pc++;
      if (J->framedepth + J->retdepth == 0)
	lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Tail-rec. */
      else
	lj_record_stop(J, LJ_TRLINK_UPREC, J->cur.traceno);  /* Up-recursion. */
    }
  } else {
    if (count > J->param[JIT_P_callunroll]) {
      if (lnk) {  /* Possible tail- or up-recursion. */
	lj_trace_flush(J, lnk);  /* Flush trace that only returns. */
	/* Set a small, pseudo-random hotcount for a quick retry of JFUNC*. */
	hotcount_set(J2GG(J), J->pc+1, lj_prng_u64(&J2G(J)->prng) & 15u);
      }
      lj_trace_err(J, LJ_TRERR_CUNROLL);
    }
  }
}